

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweepManager.cpp
# Opt level: O0

void __thiscall Memory::RecyclerSweepManager::StartPartialCollectMode(RecyclerSweepManager *this)

{
  code *pcVar1;
  bool bVar2;
  ConfigFlagsTable *pCVar3;
  undefined8 *in_FS_OFFSET;
  ulong local_18;
  size_t currentUncollectedAllocBytes;
  RecyclerSweepManager *this_local;
  
  this->inPartialCollect = (bool)(this->recycler->inPartialCollectMode & 1);
  this->recycler->inPartialCollectMode = true;
  if ((this->recycler->partialUncollectedAllocBytes != 0) && ((this->inPartialCollect & 1U) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x159,
                       "(recycler->partialUncollectedAllocBytes == 0 || this->inPartialCollect)",
                       "recycler->partialUncollectedAllocBytes == 0 || this->inPartialCollect");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  this->lastPartialUncollectedAllocBytes = this->recycler->partialUncollectedAllocBytes;
  local_18 = (this->recycler->autoHeap).uncollectedAllocBytes;
  if (local_18 < this->lastPartialUncollectedAllocBytes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x15d,
                       "(currentUncollectedAllocBytes >= this->lastPartialUncollectedAllocBytes)",
                       "currentUncollectedAllocBytes >= this->lastPartialUncollectedAllocBytes");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if ((this->inPartialCollect & 1U) == 0) {
    local_18 = (this->recycler->autoHeap).lastUncollectedAllocBytes + local_18;
  }
  this->recycler->partialUncollectedAllocBytes = local_18;
  this->nextPartialUncollectedAllocBytes = local_18;
  pCVar3 = Recycler::GetRecyclerFlagsTable(this->recycler);
  bVar2 = Js::Phases::IsEnabled(&pCVar3->Trace,PartialCollectPhase);
  if (bVar2) {
    Output::Print(L"StartPartialCollectMode\n");
    Output::Print(L"  was inPartialCollectMode = %d\n",(ulong)(this->inPartialCollect & 1));
    Output::Print(L"  lastPartialUncollectedAllocBytes = %d\n",
                  this->lastPartialUncollectedAllocBytes);
    Output::Print(L"  uncollectedAllocBytes = %d\n",(this->recycler->autoHeap).uncollectedAllocBytes
                 );
    Output::Print(L"  nextPartialUncollectedAllocBytes = %d\n",
                  this->nextPartialUncollectedAllocBytes);
  }
  return;
}

Assistant:

void
RecyclerSweepManager::StartPartialCollectMode()
{
    // Save the in partial collect, the main thread reset it after returning to the script
    // and the background thread still needs it
    this->inPartialCollect = recycler->inPartialCollectMode;
    recycler->inPartialCollectMode = true;

    // Tracks the unallocated alloc bytes for partial GC

    // Keep a copy Last collection's uncollected allocation bytes, so we can use it to calculate
    // the new object that is allocated since the last GC
    Assert(recycler->partialUncollectedAllocBytes == 0 || this->inPartialCollect);
    this->lastPartialUncollectedAllocBytes = recycler->partialUncollectedAllocBytes;

    size_t currentUncollectedAllocBytes = recycler->autoHeap.uncollectedAllocBytes;
    Assert(currentUncollectedAllocBytes >= this->lastPartialUncollectedAllocBytes);

    if (!this->inPartialCollect)
    {
        // If we did a full collect, then we need to include lastUncollectedAllocBytes
        // in the partialUncollectedAllocBytes calculation, because all objects allocated
        // since the previous GC are considered new, but we cleared uncollectedAllocBytes
        // when we kicked off the GC.
        currentUncollectedAllocBytes += recycler->autoHeap.lastUncollectedAllocBytes;
    }

    // Initially, the partial uncollected alloc bytes is the current uncollectedAllocBytes
    recycler->partialUncollectedAllocBytes = currentUncollectedAllocBytes;
    this->nextPartialUncollectedAllocBytes = currentUncollectedAllocBytes;

#ifdef RECYCLER_TRACE
    if (recycler->GetRecyclerFlagsTable().Trace.IsEnabled(Js::PartialCollectPhase))
    {
        Output::Print(_u("StartPartialCollectMode\n"));
        Output::Print(_u("  was inPartialCollectMode = %d\n"), this->inPartialCollect);
        Output::Print(_u("  lastPartialUncollectedAllocBytes = %d\n"), this->lastPartialUncollectedAllocBytes);
        Output::Print(_u("  uncollectedAllocBytes = %d\n"), recycler->autoHeap.uncollectedAllocBytes);
        Output::Print(_u("  nextPartialUncollectedAllocBytes = %d\n"), this->nextPartialUncollectedAllocBytes);
    }
#endif
}